

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_optimization_01.cpp
# Opt level: O2

void optimizaiton_example_01(void)

{
  long lVar1;
  time_t tVar2;
  ostream *poVar3;
  size_type __n;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  allocator_type local_45a;
  allocator_type local_459;
  vector<double,_std::allocator<double>_> best_position;
  vector<double,_std::allocator<double>_> points;
  _Vector_base<double,_std::allocator<double>_> local_428;
  vector<double,_std::allocator<double>_> best_objective;
  vector<double,_std::allocator<double>_> values;
  ObjectiveFunction objective;
  _Any_data local_3a8;
  code *local_398;
  code *local_390;
  double local_388 [2];
  double local_378 [2];
  _Vector_base<double,_std::allocator<double>_> local_368 [9];
  DreamDomain local_288;
  TasmanianSparseGrid grid;
  long local_260;
  DreamDomain local_1e8;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  local_1c8;
  code *local_1a8 [2];
  code *local_198;
  code *local_190;
  code *local_188 [2];
  code *local_178;
  code *local_170;
  code *local_168 [2];
  code *local_158;
  code *local_150;
  code *local_148 [2];
  code *local_138;
  code *local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  ParticleSwarmState state;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<(poVar3,
                  "---------------------------------------------------------------------------------------------------\n"
                 );
  lVar1 = std::cout;
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)(TasGrid::TasmanianSparseGrid::differentiate + *(long *)(lVar1 + -0x18)) = 5;
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "EXAMPLE 1: use the Particle Swarm algorithm to minimize the six-hump camel function\n"
                          );
  poVar3 = std::operator<<(poVar3,
                           "           f(x,y) = (4-2.1 *x^2 + x^4 / 3) * x^2 + x * y + (-4 + 4 * y^2) * y^2\n"
                          );
  poVar3 = std::operator<<(poVar3,"           domain is x in (-3, +3), y in (-2, +2)\n");
  poVar3 = std::operator<<(poVar3,"           using 50 particles and 200 iterations\n");
  std::operator<<(poVar3,"    See the comments in example_optimization_01.cpp\n\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "the problem has two solutions at (-8.98420e-02, 7.12656e-01) and (8.98420e-02, -7.12656e-01)\n"
                          );
  std::operator<<(poVar3,"the objective at the solutions is -1.03163.\n\n");
  TasOptimization::ParticleSwarmState::ParticleSwarmState(&state,2,0x32);
  objective.super__Function_base._M_functor._M_unused._M_object = (void *)0xc008000000000000;
  objective.super__Function_base._M_functor._8_8_ = 0xc000000000000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&objective;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_368,__l,
             (allocator_type *)&best_objective);
  best_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x4008000000000000;
  best_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x4000000000000000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&best_position;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&grid,__l_00,(allocator_type *)&points);
  local_148[1] = (code *)0x0;
  local_148[0] = TasDREAM::tsgCoreUniform01;
  local_130 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_138 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox(&state,local_368,&grid);
  std::_Function_base::~_Function_base((_Function_base *)local_148);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&grid);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(local_368);
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Examples/example_optimization_01.cpp:68:21)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Examples/example_optimization_01.cpp:68:21)>
              ::_M_manager;
  TasOptimization::makeObjectiveFunction(&objective,2,(ObjectiveFunctionSingle *)&local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_1c8,&objective);
  best_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xc008000000000000;
  best_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc000000000000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&best_position;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_368,__l_01,(allocator_type *)&points);
  best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x4008000000000000;
  best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x4000000000000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&best_objective;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&grid,__l_02,(allocator_type *)&values);
  TasDREAM::hypercube(&local_1e8,(vector<double,_std::allocator<double>_> *)local_368,
                      (vector<double,_std::allocator<double>_> *)&grid);
  local_168[1] = (code *)0x0;
  local_168[0] = TasDREAM::tsgCoreUniform01;
  local_150 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_158 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  TasOptimization::ParticleSwarm(0,0x4000000000000000,0,&local_1c8,&local_1e8,200,&state);
  std::_Function_base::~_Function_base((_Function_base *)local_168);
  std::_Function_base::~_Function_base(&local_1e8.super__Function_base);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&grid);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(local_368);
  std::_Function_base::~_Function_base(&local_1c8.super__Function_base);
  TasOptimization::ParticleSwarmState::getBestPosition(&best_position,&state);
  std::vector<double,_std::allocator<double>_>::vector
            (&best_objective,1,(allocator_type *)local_368);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::operator()(&objective,&best_position,&best_objective);
  poVar3 = std::operator<<((ostream *)&std::cout,"Using the objective function\n");
  poVar3 = std::operator<<(poVar3,"found best position after 200 iteration:\n");
  std::operator<<(poVar3,"best value for x = ");
  poVar3 = std::ostream::_M_insert<double>
                     (*best_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  poVar3 = std::operator<<(poVar3,"\n");
  std::operator<<(poVar3,"best value for y = ");
  poVar3 = std::ostream::_M_insert<double>
                     (best_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  poVar3 = std::operator<<(poVar3,"\n");
  std::operator<<(poVar3,"value of the objective = ");
  poVar3 = std::ostream::_M_insert<double>
                     (*best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::operator<<(poVar3,"\n\n");
  local_368[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TasGrid::makeLocalPolynomialGrid
            ((TasGrid *)&grid,2,1,10,1,rule_localp,(vector<int,_std::allocator<int>_> *)local_368);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_368);
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xc008000000000000;
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc000000000000000;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&values;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_368,__l_03,(allocator_type *)local_378
            );
  local_428._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  local_428._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_428;
  std::vector<double,_std::allocator<double>_>::vector(&points,__l_04,(allocator_type *)local_388);
  TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)&grid,(vector *)local_368);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&points.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(local_368);
  TasGrid::TasmanianSparseGrid::getNeededPoints(&points,&grid);
  if (local_260 == 0) {
    __n = 0;
  }
  else {
    __n = (size_type)*(int *)(local_260 + 0x48);
  }
  std::vector<double,_std::allocator<double>_>::vector(&values,__n,(allocator_type *)local_368);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::operator()(&objective,&points,&values);
  TasGrid::TasmanianSparseGrid::loadNeededValues((vector *)&grid);
  TasOptimization::ParticleSwarmState::ParticleSwarmState((ParticleSwarmState *)local_368,2,0x32);
  TasOptimization::ParticleSwarmState::operator=(&state,(ParticleSwarmState *)local_368);
  TasOptimization::ParticleSwarmState::~ParticleSwarmState((ParticleSwarmState *)local_368);
  local_378[0] = -3.0;
  local_378[1] = -2.0;
  __l_05._M_len = 2;
  __l_05._M_array = local_378;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_368,__l_05,&local_459);
  local_388[0] = 3.0;
  local_388[1] = 2.0;
  __l_06._M_len = 2;
  __l_06._M_array = local_388;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_428,__l_06,&local_45a);
  local_188[1] = (code *)0x0;
  local_188[0] = TasDREAM::tsgCoreUniform01;
  local_170 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_178 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox(&state,local_368,&local_428);
  std::_Function_base::~_Function_base((_Function_base *)local_188);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_428);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(local_368);
  TasGrid::TasmanianSparseGrid::enableAcceleration((TypeAcceleration)&grid);
  local_3a8._8_8_ = 0;
  local_390 = std::
              _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Examples/example_optimization_01.cpp:112:31)>
              ::_M_invoke;
  local_398 = std::
              _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Examples/example_optimization_01.cpp:112:31)>
              ::_M_manager;
  local_378[0] = -3.0;
  local_378[1] = -2.0;
  __l_07._M_len = 2;
  __l_07._M_array = local_378;
  local_3a8._M_unused._0_8_ = (undefined8)&grid;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_368,__l_07,&local_459);
  local_388[0] = 3.0;
  local_388[1] = 2.0;
  __l_08._M_len = 2;
  __l_08._M_array = local_388;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_428,__l_08,&local_45a);
  TasDREAM::hypercube(&local_288,(vector<double,_std::allocator<double>_> *)local_368,
                      (vector<double,_std::allocator<double>_> *)&local_428);
  local_1a8[1] = (code *)0x0;
  local_1a8[0] = TasDREAM::tsgCoreUniform01;
  local_190 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_198 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  TasOptimization::ParticleSwarm(0,0x4000000000000000,0,&local_3a8,&local_288,200,&state);
  std::_Function_base::~_Function_base((_Function_base *)local_1a8);
  std::_Function_base::~_Function_base(&local_288.super__Function_base);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_428);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(local_368);
  std::_Function_base::~_Function_base((_Function_base *)&local_3a8);
  TasOptimization::ParticleSwarmState::getBestPosition
            ((vector<double,_std::allocator<double>_> *)local_368,&state);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&best_position,local_368);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(local_368);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::operator()(&objective,&best_position,&best_objective);
  poVar3 = std::operator<<((ostream *)&std::cout,"Using the surrogate to the objective function\n");
  poVar3 = std::operator<<(poVar3,"found best position after 200 iteration:\n");
  std::operator<<(poVar3,"best value for x = ");
  poVar3 = std::ostream::_M_insert<double>
                     (*best_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  poVar3 = std::operator<<(poVar3,"\n");
  std::operator<<(poVar3,"best value for y = ");
  poVar3 = std::ostream::_M_insert<double>
                     (best_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  poVar3 = std::operator<<(poVar3,"\n");
  std::operator<<(poVar3,"value of the objective = ");
  poVar3 = std::ostream::_M_insert<double>
                     (*best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::operator<<(poVar3,"\n\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Note: the method will find only one of the minimums\n");
  std::operator<<(poVar3,"      the random seed will determine which one.\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<(poVar3,
                  "---------------------------------------------------------------------------------------------------\n"
                 );
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&values.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&points.super__Vector_base<double,_std::allocator<double>_>);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&grid);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&best_objective.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&best_position.super__Vector_base<double,_std::allocator<double>_>);
  std::_Function_base::~_Function_base(&objective.super__Function_base);
  TasOptimization::ParticleSwarmState::~ParticleSwarmState(&state);
  return;
}

Assistant:

void optimizaiton_example_01(){
#ifndef __TASMANIAN_DOXYGEN_SKIP
//! [OPT_Example_01 example]
#endif
    // using the default random engine, but must reset the random number generator
    std::srand(std::time(nullptr));

    // Example 1:
    cout << "\n" << "---------------------------------------------------------------------------------------------------\n";
    cout << std::scientific; cout.precision(5);
    cout << "EXAMPLE 1: use the Particle Swarm algorithm to minimize the six-hump camel function\n"
         << "           f(x,y) = (4-2.1 *x^2 + x^4 / 3) * x^2 + x * y + (-4 + 4 * y^2) * y^2\n"
         << "           domain is x in (-3, +3), y in (-2, +2)\n"
         << "           using 50 particles and 200 iterations\n"
         << "    See the comments in example_optimization_01.cpp\n\n";

     cout << "the problem has two solutions at (-8.98420e-02, 7.12656e-01) and (8.98420e-02, -7.12656e-01)\n"
          << "the objective at the solutions is -1.03163.\n\n";

     int num_dimensions = 2;
     int num_particles = 50;

     TasOptimization::ParticleSwarmState state(num_dimensions, num_particles);
     state.initializeParticlesInsideBox({-3.0, -2.0}, {3.0, 2.0});

     auto objective = TasOptimization::makeObjectiveFunction(
                    num_dimensions,
                    [](const std::vector<double> &x)->double {
                         return (4.0 - 2.1 * x[0]*x[0] + x[0]*x[0]*x[0]*x[0] / 3.0) * x[0]*x[0] +
                              x[0] * x[1] +
                              (-4.0 + 4.0 * x[1]*x[1]) * x[1]*x[1];
                    });

     int num_iterations = 200;
     double inertia_weight = 0.5, cognitive_coeff = 2.0, social_coeff = 2.0;
     TasOptimization::ParticleSwarm(objective,
                                    TasDREAM::hypercube({-3.0, -2.0}, {3.0, 2.0}),
                                    inertia_weight, cognitive_coeff, social_coeff,
                                    num_iterations, state);

     std::vector<double> best_position = state.getBestPosition();
     std::vector<double> best_objective(1);
     objective(best_position, best_objective);

     cout << "Using the objective function\n"
          << "found best position after 200 iteration:\n"
          << "best value for x = " << best_position[0] << "\n"
          << "best value for y = " << best_position[1] << "\n"
          << "value of the objective = " << best_objective[0] << "\n\n";


     // solve the same optimization problem, but use a sparse grid surrogate
     // first we create the surrogate, then we optimize

     auto grid = TasGrid::makeLocalPolynomialGrid(2, 1, 10);
     grid.setDomainTransform({-3.0, -2.0}, {3.0, 2.0});

     std::vector<double> points = grid.getNeededPoints();
     std::vector<double> values(grid.getNumNeeded());
     objective(points, values);
     grid.loadNeededValues(values); // at this point, we have the surrogate

     // reset the state
     state = TasOptimization::ParticleSwarmState(num_dimensions, num_particles);
     state.initializeParticlesInsideBox({-3.0, -2.0}, {3.0, 2.0});

     // the values of the objective function for all particle positions are computed in batch
     // thus, the problem is amenable to GPU acceleration
     // Note: if GPU acceleration is not available, Tasmanian will automatically fallback to CPU
     grid.enableAcceleration(TasGrid::accel_gpu_cuda);
     TasOptimization::ParticleSwarm(
                              [&](std::vector<double> const &x, std::vector<double> &y)->void{
                                   grid.evaluateBatch(x, y);
                              },
                              TasDREAM::hypercube({-3.0, -2.0}, {3.0, 2.0}),
                              inertia_weight, cognitive_coeff, social_coeff,
                              num_iterations, state);

     best_position = state.getBestPosition();
     objective(best_position, best_objective);

     cout << "Using the surrogate to the objective function\n"
          << "found best position after 200 iteration:\n"
          << "best value for x = " << best_position[0] << "\n"
          << "best value for y = " << best_position[1] << "\n"
          << "value of the objective = " << best_objective[0] << "\n\n";

     cout << "Note: the method will find only one of the minimums\n"
          << "      the random seed will determine which one.\n";


    cout << "\n" << "---------------------------------------------------------------------------------------------------\n";
#ifndef __TASMANIAN_DOXYGEN_SKIP
//! [OPT_Example_01 example]
#endif
}